

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_time.c
# Opt level: O3

int evutil_gettime_monotonic_(evutil_monotonic_timer *base,timeval *tp)

{
  long lVar1;
  __suseconds_t _Var2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  timespec ts;
  timespec local_20;
  
  if (-1 < base->monotonic_clock) {
    iVar3 = clock_gettime(base->monotonic_clock,&local_20);
    if (iVar3 != -1) {
      tp->tv_sec = local_20.tv_sec;
      tp->tv_usec = local_20.tv_nsec / 1000;
      return 0;
    }
    return -1;
  }
  iVar3 = gettimeofday((timeval *)tp,(__timezone_ptr_t)0x0);
  if (iVar3 < 0) {
    return -1;
  }
  lVar6 = (base->adjust_monotonic_clock).tv_sec + tp->tv_sec;
  tp->tv_sec = lVar6;
  lVar4 = (base->adjust_monotonic_clock).tv_usec + tp->tv_usec;
  tp->tv_usec = lVar4;
  if (999999 < lVar4) {
    lVar6 = lVar6 + 1;
    tp->tv_sec = lVar6;
    lVar4 = lVar4 + -1000000;
    tp->tv_usec = lVar4;
  }
  lVar1 = (base->last_time).tv_sec;
  lVar5 = lVar1 - lVar6;
  if (lVar5 != 0) {
    if (lVar5 == 0 || lVar1 < lVar6) goto LAB_00250ade;
    lVar6 = (base->last_time).tv_usec;
  }
  else {
    lVar6 = (base->last_time).tv_usec;
    if (lVar6 <= lVar4) goto LAB_00250ade;
  }
  lVar6 = lVar6 - lVar4;
  lVar4 = lVar6 + 1000000;
  if (-1 < lVar6) {
    lVar4 = lVar6;
  }
  lVar6 = lVar5 + (base->adjust_monotonic_clock).tv_sec + (lVar6 >> 0x3f);
  (base->adjust_monotonic_clock).tv_sec = lVar6;
  lVar4 = lVar4 + (base->adjust_monotonic_clock).tv_usec;
  (base->adjust_monotonic_clock).tv_usec = lVar4;
  if (999999 < lVar4) {
    (base->adjust_monotonic_clock).tv_sec = lVar6 + 1;
    (base->adjust_monotonic_clock).tv_usec = lVar4 + -1000000;
  }
  _Var2 = (base->last_time).tv_usec;
  tp->tv_sec = (base->last_time).tv_sec;
  tp->tv_usec = _Var2;
LAB_00250ade:
  _Var2 = tp->tv_usec;
  (base->last_time).tv_sec = tp->tv_sec;
  (base->last_time).tv_usec = _Var2;
  return 0;
}

Assistant:

int
evutil_gettime_monotonic_(struct evutil_monotonic_timer *base,
    struct timeval *tp)
{
	struct timespec ts;

	if (base->monotonic_clock < 0) {
		if (evutil_gettimeofday(tp, NULL) < 0)
			return -1;
		adjust_monotonic_time(base, tp);
		return 0;
	}

	if (clock_gettime(base->monotonic_clock, &ts) == -1)
		return -1;
	tp->tv_sec = ts.tv_sec;
	tp->tv_usec = ts.tv_nsec / 1000;

	return 0;
}